

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  bool bVar29;
  byte bVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  undefined1 (*pauVar34) [32];
  ulong uVar35;
  uint uVar36;
  ulong *puVar37;
  NodeRef root;
  long lVar38;
  long lVar39;
  undefined4 uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [32];
  undefined1 auVar61 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar80 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  TravRayK<8,_false> tray;
  Vec3vf<8> Ng;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5ddc;
  Precalculations local_5dc1;
  RayQueryContext *local_5dc0;
  size_t local_5db8;
  undefined4 local_5db0;
  uint local_5dac;
  RayK<8> *local_5da8;
  Geometry *local_5da0;
  RTCFilterFunctionNArguments local_5d98;
  BVH *local_5d68;
  Intersectors *local_5d60;
  ulong local_5d58;
  long local_5d50;
  long local_5d48;
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d00;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ce0;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined4 uStack_5b64;
  undefined1 local_5b60 [32];
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  uint local_5b20;
  uint uStack_5b1c;
  uint uStack_5b18;
  uint uStack_5b14;
  uint uStack_5b10;
  uint uStack_5b0c;
  uint uStack_5b08;
  uint uStack_5b04;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b00;
  RTCRayQueryContext local_5ae0 [4];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ac0;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5aa0;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  float local_5980;
  float fStack_597c;
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined4 uStack_5964;
  float local_5960;
  float fStack_595c;
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  undefined1 local_5940 [32];
  int local_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  uint local_58e0;
  uint uStack_58dc;
  uint uStack_58d8;
  uint uStack_58d4;
  uint uStack_58d0;
  uint uStack_58cc;
  uint uStack_58c8;
  uint uStack_58c4;
  uint local_58c0;
  uint uStack_58bc;
  uint uStack_58b8;
  uint uStack_58b4;
  uint uStack_58b0;
  uint uStack_58ac;
  uint uStack_58a8;
  uint uStack_58a4;
  undefined1 local_58a0 [32];
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5860;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5840;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  undefined1 auVar49 [32];
  
  local_5d68 = (BVH *)This->ptr;
  local_5808 = (local_5d68->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar45 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar42 = ZEXT816(0) << 0x40;
      uVar41 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar42),5);
      uVar12 = vpcmpeqd_avx512vl(auVar45,(undefined1  [32])valid_i->field_0);
      uVar41 = uVar41 & uVar12;
      bVar30 = (byte)uVar41;
      if (bVar30 != 0) {
        local_5aa0._0_4_ = *(undefined4 *)ray;
        local_5aa0._4_4_ = *(undefined4 *)(ray + 4);
        local_5aa0._8_4_ = *(undefined4 *)(ray + 8);
        local_5aa0._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5aa0._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5aa0._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5aa0._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5aa0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5aa0._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5aa0._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5aa0._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5aa0._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5aa0._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5aa0._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5aa0._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5aa0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5aa0._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5aa0._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5aa0._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5aa0._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5aa0._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5aa0._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5aa0._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5aa0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5a40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5a20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5a00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar47._8_4_ = 0x7fffffff;
        auVar47._0_8_ = 0x7fffffff7fffffff;
        auVar47._12_4_ = 0x7fffffff;
        auVar47._16_4_ = 0x7fffffff;
        auVar47._20_4_ = 0x7fffffff;
        auVar47._24_4_ = 0x7fffffff;
        auVar47._28_4_ = 0x7fffffff;
        auVar45 = vandps_avx(auVar47,local_5a40);
        auVar43._8_4_ = 0x219392ef;
        auVar43._0_8_ = 0x219392ef219392ef;
        auVar43._12_4_ = 0x219392ef;
        auVar43._16_4_ = 0x219392ef;
        auVar43._20_4_ = 0x219392ef;
        auVar43._24_4_ = 0x219392ef;
        auVar43._28_4_ = 0x219392ef;
        uVar12 = vcmpps_avx512vl(auVar45,auVar43,1);
        bVar29 = (bool)((byte)uVar12 & 1);
        auVar44._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._0_4_;
        bVar29 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._4_4_;
        bVar29 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._8_4_;
        bVar29 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._12_4_;
        bVar29 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._16_4_;
        bVar29 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._20_4_;
        bVar29 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._24_4_;
        bVar29 = SUB81(uVar12 >> 7,0);
        auVar44._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a40._28_4_;
        auVar45 = vandps_avx(auVar47,local_5a20);
        uVar12 = vcmpps_avx512vl(auVar45,auVar43,1);
        bVar29 = (bool)((byte)uVar12 & 1);
        auVar48._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._0_4_;
        bVar29 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._4_4_;
        bVar29 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._8_4_;
        bVar29 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._12_4_;
        bVar29 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._16_4_;
        bVar29 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._20_4_;
        bVar29 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._24_4_;
        bVar29 = SUB81(uVar12 >> 7,0);
        auVar48._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a20._28_4_;
        auVar45 = vandps_avx(auVar47,local_5a00);
        uVar12 = vcmpps_avx512vl(auVar45,auVar43,1);
        bVar29 = (bool)((byte)uVar12 & 1);
        auVar45._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._0_4_;
        bVar29 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._4_4_;
        bVar29 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._8_4_;
        bVar29 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._12_4_;
        bVar29 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._16_4_;
        bVar29 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._20_4_;
        bVar29 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._24_4_;
        bVar29 = SUB81(uVar12 >> 7,0);
        auVar45._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * local_5a00._28_4_;
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        auVar46._16_4_ = 0x3f800000;
        auVar46._20_4_ = 0x3f800000;
        auVar46._24_4_ = 0x3f800000;
        auVar46._28_4_ = 0x3f800000;
        auVar43 = vrcp14ps_avx512vl(auVar44);
        auVar15 = vfnmadd213ps_fma(auVar44,auVar43,auVar46);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar43,auVar43);
        auVar44 = vrcp14ps_avx512vl(auVar48);
        auVar16 = vfnmadd213ps_fma(auVar48,auVar44,auVar46);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar44,auVar44);
        auVar44 = vrcp14ps_avx512vl(auVar45);
        auVar17 = vfnmadd213ps_fma(auVar45,auVar44,auVar46);
        local_59e0 = ZEXT1632(auVar15);
        local_59c0 = ZEXT1632(auVar16);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar44,auVar44);
        local_59a0 = ZEXT1632(auVar17);
        local_5980 = (float)local_5aa0._0_4_ * auVar15._0_4_;
        fStack_597c = (float)local_5aa0._4_4_ * auVar15._4_4_;
        fStack_5978 = (float)local_5aa0._8_4_ * auVar15._8_4_;
        fStack_5974 = (float)local_5aa0._12_4_ * auVar15._12_4_;
        fStack_5970 = (float)local_5aa0._16_4_ * 0.0;
        fStack_596c = (float)local_5aa0._20_4_ * 0.0;
        fStack_5968 = (float)local_5aa0._24_4_ * 0.0;
        local_5960 = (float)local_5aa0._32_4_ * auVar16._0_4_;
        fStack_595c = (float)local_5aa0._36_4_ * auVar16._4_4_;
        fStack_5958 = (float)local_5aa0._40_4_ * auVar16._8_4_;
        fStack_5954 = (float)local_5aa0._44_4_ * auVar16._12_4_;
        fStack_5950 = (float)local_5aa0._48_4_ * 0.0;
        fStack_594c = (float)local_5aa0._52_4_ * 0.0;
        fStack_5948 = (float)local_5aa0._56_4_ * 0.0;
        local_5940._4_4_ = (float)local_5aa0._68_4_ * auVar17._4_4_;
        local_5940._0_4_ = (float)local_5aa0._64_4_ * auVar17._0_4_;
        local_5940._8_4_ = (float)local_5aa0._72_4_ * auVar17._8_4_;
        local_5940._12_4_ = (float)local_5aa0._76_4_ * auVar17._12_4_;
        local_5940._16_4_ = (float)local_5aa0._80_4_ * 0.0;
        local_5940._20_4_ = (float)local_5aa0._84_4_ * 0.0;
        local_5940._24_4_ = (float)local_5aa0._88_4_ * 0.0;
        local_5940._28_4_ = local_5aa0._92_4_;
        uVar12 = vcmpps_avx512vl(ZEXT1632(auVar15),ZEXT1632(auVar42),1);
        auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5920 = (uint)((byte)uVar12 & 1) * auVar45._0_4_;
        iStack_591c = (uint)((byte)(uVar12 >> 1) & 1) * auVar45._4_4_;
        iStack_5918 = (uint)((byte)(uVar12 >> 2) & 1) * auVar45._8_4_;
        iStack_5914 = (uint)((byte)(uVar12 >> 3) & 1) * auVar45._12_4_;
        iStack_5910 = (uint)((byte)(uVar12 >> 4) & 1) * auVar45._16_4_;
        iStack_590c = (uint)((byte)(uVar12 >> 5) & 1) * auVar45._20_4_;
        iStack_5908 = (uint)((byte)(uVar12 >> 6) & 1) * auVar45._24_4_;
        iStack_5904 = (uint)(byte)(uVar12 >> 7) * auVar45._28_4_;
        auVar44 = ZEXT1632(auVar42);
        uVar12 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar44,5);
        auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar29 = (bool)((byte)uVar12 & 1);
        local_5900 = (uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 1) & 1);
        uStack_58fc = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 2) & 1);
        uStack_58f8 = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 3) & 1);
        uStack_58f4 = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 4) & 1);
        uStack_58f0 = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 5) & 1);
        uStack_58ec = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * 0x60;
        bVar29 = (bool)((byte)(uVar12 >> 6) & 1);
        uStack_58e8 = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * 0x60;
        bVar29 = SUB81(uVar12 >> 7,0);
        uStack_58e4 = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * 0x60;
        uVar12 = vcmpps_avx512vl(ZEXT1632(auVar17),auVar44,5);
        auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar29 = (bool)((byte)uVar12 & 1);
        local_58e0 = (uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 1) & 1);
        uStack_58dc = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 2) & 1);
        uStack_58d8 = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 3) & 1);
        uStack_58d4 = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 4) & 1);
        uStack_58d0 = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 5) & 1);
        uStack_58cc = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = (bool)((byte)(uVar12 >> 6) & 1);
        uStack_58c8 = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * 0xa0;
        bVar29 = SUB81(uVar12 >> 7,0);
        uStack_58c4 = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar78 = ZEXT3264(local_4680);
        auVar45 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar44);
        local_58c0 = (uint)(bVar30 & 1) * auVar45._0_4_ |
                     (uint)!(bool)(bVar30 & 1) * local_4680._0_4_;
        bVar29 = (bool)((byte)(uVar41 >> 1) & 1);
        uStack_58bc = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * local_4680._4_4_;
        bVar29 = (bool)((byte)(uVar41 >> 2) & 1);
        uStack_58b8 = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * local_4680._8_4_;
        bVar29 = (bool)((byte)(uVar41 >> 3) & 1);
        uStack_58b4 = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * local_4680._12_4_;
        bVar29 = (bool)((byte)(uVar41 >> 4) & 1);
        uStack_58b0 = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * local_4680._16_4_;
        bVar29 = (bool)((byte)(uVar41 >> 5) & 1);
        uStack_58ac = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * local_4680._20_4_;
        bVar29 = (bool)((byte)(uVar41 >> 6) & 1);
        uStack_58a8 = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * local_4680._24_4_;
        bVar29 = SUB81(uVar41 >> 7,0);
        uStack_58a4 = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * local_4680._28_4_;
        local_5db0 = (undefined4)uVar41;
        auVar45 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar44);
        local_58a0._0_4_ =
             (uint)(bVar30 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar30 & 1) * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 1) & 1);
        local_58a0._4_4_ = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 2) & 1);
        local_58a0._8_4_ = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 3) & 1);
        local_58a0._12_4_ = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 4) & 1);
        local_58a0._16_4_ = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 5) & 1);
        local_58a0._20_4_ = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = (bool)((byte)(uVar41 >> 6) & 1);
        local_58a0._24_4_ = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * -0x800000;
        bVar29 = SUB81(uVar41 >> 7,0);
        local_58a0._28_4_ = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * -0x800000;
        local_5ddc = (uint)(byte)~bVar30;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar36 = 7;
        }
        else {
          uVar36 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5da8 = ray + 0x100;
        puVar37 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar34 = (undefined1 (*) [32])local_4640;
        local_4660 = local_58c0;
        uStack_465c = uStack_58bc;
        uStack_4658 = uStack_58b8;
        uStack_4654 = uStack_58b4;
        uStack_4650 = uStack_58b0;
        uStack_464c = uStack_58ac;
        uStack_4648 = uStack_58a8;
        uStack_4644 = uStack_58a4;
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar79 = ZEXT3264(auVar45);
        auVar42 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar80 = ZEXT1664(auVar42);
        local_5dc0 = context;
        local_5d60 = This;
        uStack_5964 = local_5aa0._28_4_;
        uStack_5944 = local_5aa0._60_4_;
LAB_01dd165f:
        do {
          do {
            root.ptr = puVar37[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd200d;
            puVar37 = puVar37 + -1;
            pauVar34 = pauVar34 + -1;
            auVar45 = *pauVar34;
            auVar75 = ZEXT3264(auVar45);
            uVar41 = vcmpps_avx512vl(auVar45,local_58a0,1);
          } while ((char)uVar41 == '\0');
          uVar40 = (undefined4)uVar41;
          if (uVar36 < (uint)POPCOUNT(uVar40)) {
LAB_01dd169f:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd200d;
                uVar10 = vcmpps_avx512vl(auVar75._0_32_,local_58a0,9);
                if ((char)uVar10 == '\0') goto LAB_01dd165f;
                local_5d50 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar32 = (uint)(byte)~(byte)local_5ddc;
                lVar38 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                lVar33 = 0;
                goto LAB_01dd1869;
              }
              uVar41 = 8;
              auVar45 = auVar78._0_32_;
              for (lVar33 = 0;
                  (auVar75 = ZEXT3264(auVar45), lVar33 != 8 &&
                  (uVar12 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar33 * 8), uVar12 != 8));
                  lVar33 = lVar33 + 1) {
                auVar26._4_4_ = fStack_597c;
                auVar26._0_4_ = local_5980;
                auVar26._8_4_ = fStack_5978;
                auVar26._12_4_ = fStack_5974;
                auVar26._16_4_ = fStack_5970;
                auVar26._20_4_ = fStack_596c;
                auVar26._24_4_ = fStack_5968;
                auVar26._28_4_ = uStack_5964;
                uVar40 = *(undefined4 *)(root.ptr + 0x40 + lVar33 * 4);
                auVar64._4_4_ = uVar40;
                auVar64._0_4_ = uVar40;
                auVar64._8_4_ = uVar40;
                auVar64._12_4_ = uVar40;
                auVar64._16_4_ = uVar40;
                auVar64._20_4_ = uVar40;
                auVar64._24_4_ = uVar40;
                auVar64._28_4_ = uVar40;
                auVar42 = vfmsub132ps_fma(auVar64,auVar26,local_59e0);
                auVar27._4_4_ = fStack_595c;
                auVar27._0_4_ = local_5960;
                auVar27._8_4_ = fStack_5958;
                auVar27._12_4_ = fStack_5954;
                auVar27._16_4_ = fStack_5950;
                auVar27._20_4_ = fStack_594c;
                auVar27._24_4_ = fStack_5948;
                auVar27._28_4_ = uStack_5944;
                uVar40 = *(undefined4 *)(root.ptr + 0x80 + lVar33 * 4);
                auVar69._4_4_ = uVar40;
                auVar69._0_4_ = uVar40;
                auVar69._8_4_ = uVar40;
                auVar69._12_4_ = uVar40;
                auVar69._16_4_ = uVar40;
                auVar69._20_4_ = uVar40;
                auVar69._24_4_ = uVar40;
                auVar69._28_4_ = uVar40;
                uVar40 = *(undefined4 *)(root.ptr + 0xc0 + lVar33 * 4);
                auVar72._4_4_ = uVar40;
                auVar72._0_4_ = uVar40;
                auVar72._8_4_ = uVar40;
                auVar72._12_4_ = uVar40;
                auVar72._16_4_ = uVar40;
                auVar72._20_4_ = uVar40;
                auVar72._24_4_ = uVar40;
                auVar72._28_4_ = uVar40;
                auVar15 = vfmsub132ps_fma(auVar69,auVar27,local_59c0);
                auVar16 = vfmsub132ps_fma(auVar72,local_5940,local_59a0);
                uVar40 = *(undefined4 *)(root.ptr + 0x60 + lVar33 * 4);
                auVar18._4_4_ = uVar40;
                auVar18._0_4_ = uVar40;
                auVar18._8_4_ = uVar40;
                auVar18._12_4_ = uVar40;
                auVar18._16_4_ = uVar40;
                auVar18._20_4_ = uVar40;
                auVar18._24_4_ = uVar40;
                auVar18._28_4_ = uVar40;
                auVar43 = vfmsub132ps_avx512vl(local_59e0,auVar26,auVar18);
                uVar40 = *(undefined4 *)(root.ptr + 0xa0 + lVar33 * 4);
                auVar19._4_4_ = uVar40;
                auVar19._0_4_ = uVar40;
                auVar19._8_4_ = uVar40;
                auVar19._12_4_ = uVar40;
                auVar19._16_4_ = uVar40;
                auVar19._20_4_ = uVar40;
                auVar19._24_4_ = uVar40;
                auVar19._28_4_ = uVar40;
                auVar46 = vfmsub132ps_avx512vl(local_59c0,auVar27,auVar19);
                uVar40 = *(undefined4 *)(root.ptr + 0xe0 + lVar33 * 4);
                auVar20._4_4_ = uVar40;
                auVar20._0_4_ = uVar40;
                auVar20._8_4_ = uVar40;
                auVar20._12_4_ = uVar40;
                auVar20._16_4_ = uVar40;
                auVar20._20_4_ = uVar40;
                auVar20._24_4_ = uVar40;
                auVar20._28_4_ = uVar40;
                auVar47 = vfmsub132ps_avx512vl(local_59a0,local_5940,auVar20);
                auVar44 = vpminsd_avx2(ZEXT1632(auVar42),auVar43);
                auVar48 = vpminsd_avx2(ZEXT1632(auVar15),auVar46);
                auVar44 = vpmaxsd_avx2(auVar44,auVar48);
                auVar48 = vpminsd_avx2(ZEXT1632(auVar16),auVar47);
                auVar44 = vpmaxsd_avx2(auVar44,auVar48);
                auVar48 = vpmaxsd_avx2(ZEXT1632(auVar42),auVar43);
                auVar43 = vpmaxsd_avx2(ZEXT1632(auVar15),auVar46);
                auVar43 = vpminsd_avx2(auVar48,auVar43);
                auVar48 = vpmaxsd_avx2(ZEXT1632(auVar16),auVar47);
                auVar43 = vpminsd_avx2(auVar43,auVar48);
                auVar28._4_4_ = uStack_58bc;
                auVar28._0_4_ = local_58c0;
                auVar28._8_4_ = uStack_58b8;
                auVar28._12_4_ = uStack_58b4;
                auVar28._16_4_ = uStack_58b0;
                auVar28._20_4_ = uStack_58ac;
                auVar28._24_4_ = uStack_58a8;
                auVar28._28_4_ = uStack_58a4;
                auVar48 = vpmaxsd_avx2(auVar44,auVar28);
                auVar43 = vpminsd_avx2(auVar43,local_58a0);
                uVar13 = vpcmpd_avx512vl(auVar48,auVar43,2);
                uVar35 = uVar41;
                auVar49 = auVar45;
                if ((byte)uVar13 != 0) {
                  auVar48 = vblendmps_avx512vl(auVar78._0_32_,auVar44);
                  bVar29 = (bool)((byte)uVar13 & 1);
                  auVar49._0_4_ = (uint)bVar29 * auVar48._0_4_ | (uint)!bVar29 * auVar44._0_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 1) & 1);
                  auVar49._4_4_ = (uint)bVar29 * auVar48._4_4_ | (uint)!bVar29 * auVar44._4_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 2) & 1);
                  auVar49._8_4_ = (uint)bVar29 * auVar48._8_4_ | (uint)!bVar29 * auVar44._8_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 3) & 1);
                  auVar49._12_4_ = (uint)bVar29 * auVar48._12_4_ | (uint)!bVar29 * auVar44._12_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 4) & 1);
                  auVar49._16_4_ = (uint)bVar29 * auVar48._16_4_ | (uint)!bVar29 * auVar44._16_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 5) & 1);
                  auVar49._20_4_ = (uint)bVar29 * auVar48._20_4_ | (uint)!bVar29 * auVar44._20_4_;
                  bVar29 = (bool)((byte)(uVar13 >> 6) & 1);
                  auVar49._24_4_ = (uint)bVar29 * auVar48._24_4_ | (uint)!bVar29 * auVar44._24_4_;
                  bVar29 = SUB81(uVar13 >> 7,0);
                  auVar49._28_4_ = (uint)bVar29 * auVar48._28_4_ | (uint)!bVar29 * auVar44._28_4_;
                  uVar35 = uVar12;
                  if (uVar41 != 8) {
                    *puVar37 = uVar41;
                    puVar37 = puVar37 + 1;
                    *pauVar34 = auVar45;
                    pauVar34 = pauVar34 + 1;
                  }
                }
                auVar45 = auVar49;
                uVar41 = uVar35;
              }
              if (uVar41 == 8) goto LAB_01dd1805;
              uVar10 = vcmpps_avx512vl(auVar45,local_58a0,9);
              root.ptr = uVar41;
            } while ((byte)uVar36 < (byte)POPCOUNT((int)uVar10));
            *puVar37 = uVar41;
            puVar37 = puVar37 + 1;
            *pauVar34 = auVar45;
            pauVar34 = pauVar34 + 1;
LAB_01dd1805:
            iVar31 = 4;
          }
          else {
            while( true ) {
              local_5d40 = auVar45;
              auVar42 = auVar80._0_16_;
              bVar30 = (byte)local_5ddc;
              if (uVar41 == 0) break;
              local_5db8 = 0;
              for (uVar12 = uVar41; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                local_5db8 = local_5db8 + 1;
              }
              uVar41 = uVar41 - 1 & uVar41;
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar29 = occluded1(local_5d60,local_5d68,root,local_5db8,&local_5dc1,ray,
                                 (TravRayK<8,_false> *)&local_5aa0.field_0,local_5dc0);
              auVar42 = vxorps_avx512vl(auVar42,auVar42);
              auVar80 = ZEXT1664(auVar42);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar79 = ZEXT3264(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar78 = ZEXT3264(auVar45);
              bVar25 = (byte)(1 << ((uint)local_5db8 & 0x1f));
              if (!bVar29) {
                bVar25 = 0;
              }
              local_5ddc = (uint)(bVar30 | bVar25);
              auVar45 = local_5d40;
            }
            iVar31 = 3;
            auVar75 = ZEXT3264(local_5d40);
            if (bVar30 != 0xff) {
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_58a0._0_4_ =
                   (uint)(bVar30 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar30 & 1) * local_58a0._0_4_
              ;
              bVar29 = (bool)((byte)(local_5ddc >> 1) & 1);
              local_58a0._4_4_ = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * local_58a0._4_4_;
              bVar29 = (bool)((byte)(local_5ddc >> 2) & 1);
              local_58a0._8_4_ = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * local_58a0._8_4_;
              bVar29 = (bool)((byte)(local_5ddc >> 3) & 1);
              local_58a0._12_4_ = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * local_58a0._12_4_;
              bVar29 = (bool)((byte)(local_5ddc >> 4) & 1);
              local_58a0._16_4_ = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * local_58a0._16_4_;
              bVar29 = (bool)((byte)(local_5ddc >> 5) & 1);
              local_58a0._20_4_ = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * local_58a0._20_4_;
              bVar29 = (bool)((byte)(local_5ddc >> 6) & 1);
              local_58a0._24_4_ = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * local_58a0._24_4_;
              local_58a0._28_4_ =
                   (local_5ddc >> 7) * auVar45._28_4_ |
                   (uint)!SUB41(local_5ddc >> 7,0) * local_58a0._28_4_;
              iVar31 = 2;
            }
            if (uVar36 < (uint)POPCOUNT(uVar40)) goto LAB_01dd169f;
          }
        } while ((iVar31 == 4) || (iVar31 == 2));
LAB_01dd200d:
        bVar30 = (byte)local_5ddc;
LAB_01dd2015:
        bVar30 = bVar30 & (byte)local_5db0;
        bVar29 = (bool)(bVar30 >> 1 & 1);
        bVar4 = (bool)(bVar30 >> 2 & 1);
        bVar5 = (bool)(bVar30 >> 3 & 1);
        bVar6 = (bool)(bVar30 >> 4 & 1);
        bVar7 = (bool)(bVar30 >> 5 & 1);
        bVar8 = (bool)(bVar30 >> 6 & 1);
        *(uint *)local_5da8 =
             (uint)(bVar30 & 1) * -0x800000 | (uint)!(bool)(bVar30 & 1) * *(int *)local_5da8;
        *(uint *)(local_5da8 + 4) =
             (uint)bVar29 * -0x800000 | (uint)!bVar29 * *(int *)(local_5da8 + 4);
        *(uint *)(local_5da8 + 8) =
             (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5da8 + 8);
        *(uint *)(local_5da8 + 0xc) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5da8 + 0xc);
        *(uint *)(local_5da8 + 0x10) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5da8 + 0x10);
        *(uint *)(local_5da8 + 0x14) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5da8 + 0x14);
        *(uint *)(local_5da8 + 0x18) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5da8 + 0x18);
        *(uint *)(local_5da8 + 0x1c) =
             (uint)(bVar30 >> 7) * -0x800000 |
             (uint)!(bool)(bVar30 >> 7) * *(int *)(local_5da8 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01dd1869:
  do {
    lVar39 = -0x10;
    uVar1 = uVar32;
    if (lVar33 == local_5d50) goto LAB_01dd1ee6;
    do {
      local_5d48 = lVar33;
      local_5dac = uVar1;
      if ((lVar39 == 0) || (uVar41 = (ulong)*(uint *)(lVar38 + lVar39), uVar41 == 0xffffffff))
      goto LAB_01dd1ec5;
      uVar40 = *(undefined4 *)(lVar38 + -0x90 + lVar39);
      auVar62._4_4_ = uVar40;
      auVar62._0_4_ = uVar40;
      auVar62._8_4_ = uVar40;
      auVar62._12_4_ = uVar40;
      auVar62._16_4_ = uVar40;
      auVar62._20_4_ = uVar40;
      auVar62._24_4_ = uVar40;
      auVar62._28_4_ = uVar40;
      uVar40 = *(undefined4 *)(lVar38 + -0x80 + lVar39);
      auVar67._4_4_ = uVar40;
      auVar67._0_4_ = uVar40;
      auVar67._8_4_ = uVar40;
      auVar67._12_4_ = uVar40;
      auVar67._16_4_ = uVar40;
      auVar67._20_4_ = uVar40;
      auVar67._24_4_ = uVar40;
      auVar67._28_4_ = uVar40;
      uVar40 = *(undefined4 *)(lVar38 + -0x70 + lVar39);
      auVar71._4_4_ = uVar40;
      auVar71._0_4_ = uVar40;
      auVar71._8_4_ = uVar40;
      auVar71._12_4_ = uVar40;
      auVar71._16_4_ = uVar40;
      auVar71._20_4_ = uVar40;
      auVar71._24_4_ = uVar40;
      auVar71._28_4_ = uVar40;
      fVar56 = *(float *)(lVar38 + -0x60 + lVar39);
      auVar65._4_4_ = fVar56;
      auVar65._0_4_ = fVar56;
      auVar65._8_4_ = fVar56;
      auVar65._12_4_ = fVar56;
      auVar65._16_4_ = fVar56;
      auVar65._20_4_ = fVar56;
      auVar65._24_4_ = fVar56;
      auVar65._28_4_ = fVar56;
      uVar40 = *(undefined4 *)(lVar38 + -0x50 + lVar39);
      auVar42._4_4_ = uVar40;
      auVar42._0_4_ = uVar40;
      auVar42._8_4_ = uVar40;
      auVar42._12_4_ = uVar40;
      auVar70._16_4_ = uVar40;
      auVar70._0_16_ = auVar42;
      auVar70._20_4_ = uVar40;
      auVar70._24_4_ = uVar40;
      auVar70._28_4_ = uVar40;
      fVar58 = *(float *)(lVar38 + -0x40 + lVar39);
      auVar74._4_4_ = fVar58;
      auVar74._0_4_ = fVar58;
      auVar74._8_4_ = fVar58;
      auVar74._12_4_ = fVar58;
      auVar74._16_4_ = fVar58;
      auVar74._20_4_ = fVar58;
      auVar74._24_4_ = fVar58;
      auVar74._28_4_ = fVar58;
      fVar59 = *(float *)(lVar38 + -0x30 + lVar39);
      auVar73._4_4_ = fVar59;
      auVar73._0_4_ = fVar59;
      auVar73._8_4_ = fVar59;
      auVar73._12_4_ = fVar59;
      auVar73._16_4_ = fVar59;
      auVar73._20_4_ = fVar59;
      auVar73._24_4_ = fVar59;
      auVar73._28_4_ = fVar59;
      fVar60 = *(float *)(lVar38 + -0x20 + lVar39);
      auVar77._4_4_ = fVar60;
      auVar77._0_4_ = fVar60;
      auVar77._8_4_ = fVar60;
      auVar77._12_4_ = fVar60;
      auVar77._16_4_ = fVar60;
      auVar77._20_4_ = fVar60;
      auVar77._24_4_ = fVar60;
      auVar77._28_4_ = fVar60;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar38 + -0x10 + lVar39)));
      auVar42 = vmulss_avx512f(auVar42,auVar50._0_16_);
      auVar53._0_4_ = auVar42._0_4_;
      auVar53._4_4_ = auVar53._0_4_;
      auVar53._8_4_ = auVar53._0_4_;
      auVar53._12_4_ = auVar53._0_4_;
      auVar53._16_4_ = auVar53._0_4_;
      auVar53._20_4_ = auVar53._0_4_;
      auVar53._24_4_ = auVar53._0_4_;
      auVar53._28_4_ = auVar53._0_4_;
      auVar15 = vfmsub231ps_fma(auVar53,auVar77,auVar74);
      fVar59 = fVar58 * fVar59;
      auVar57._4_4_ = fVar59;
      auVar57._0_4_ = fVar59;
      auVar57._8_4_ = fVar59;
      auVar57._12_4_ = fVar59;
      auVar57._16_4_ = fVar59;
      auVar57._20_4_ = fVar59;
      auVar57._24_4_ = fVar59;
      auVar57._28_4_ = fVar59;
      aVar51 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
               vfmsub231ps_avx512vl(auVar57,auVar50,auVar65);
      fVar60 = fVar60 * fVar56;
      auVar61._4_4_ = fVar60;
      auVar61._0_4_ = fVar60;
      auVar61._8_4_ = fVar60;
      auVar61._12_4_ = fVar60;
      auVar61._16_4_ = fVar60;
      auVar61._20_4_ = fVar60;
      auVar61._24_4_ = fVar60;
      auVar61._28_4_ = fVar60;
      auVar16 = vfmsub231ps_fma(auVar61,auVar73,auVar70);
      auVar43 = vsubps_avx(auVar62,*(undefined1 (*) [32])ray);
      auVar46 = vsubps_avx(auVar67,*(undefined1 (*) [32])(ray + 0x20));
      auVar47 = vsubps_avx(auVar71,*(undefined1 (*) [32])(ray + 0x40));
      auVar45 = *(undefined1 (*) [32])(ray + 0x80);
      auVar44 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar48 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar52 = vmulps_avx512vl(auVar44,auVar47);
      auVar17 = vfmsub231ps_fma(auVar52,auVar46,auVar48);
      auVar75._0_4_ = auVar48._0_4_ * auVar43._0_4_;
      auVar75._4_4_ = auVar48._4_4_ * auVar43._4_4_;
      auVar75._8_4_ = auVar48._8_4_ * auVar43._8_4_;
      auVar75._12_4_ = auVar48._12_4_ * auVar43._12_4_;
      auVar75._16_4_ = auVar48._16_4_ * auVar43._16_4_;
      auVar75._20_4_ = auVar48._20_4_ * auVar43._20_4_;
      auVar75._28_36_ = in_ZMM13._28_36_;
      auVar75._24_4_ = auVar48._24_4_ * auVar43._24_4_;
      auVar14 = vfmsub231ps_fma(auVar75._0_32_,auVar47,auVar45);
      in_ZMM13 = ZEXT1664(auVar14);
      auVar76._0_4_ = auVar45._0_4_ * auVar46._0_4_;
      auVar76._4_4_ = auVar45._4_4_ * auVar46._4_4_;
      auVar76._8_4_ = auVar45._8_4_ * auVar46._8_4_;
      auVar76._12_4_ = auVar45._12_4_ * auVar46._12_4_;
      auVar76._16_4_ = auVar45._16_4_ * auVar46._16_4_;
      auVar76._20_4_ = auVar45._20_4_ * auVar46._20_4_;
      auVar76._28_36_ = in_ZMM14._28_36_;
      auVar76._24_4_ = auVar45._24_4_ * auVar46._24_4_;
      auVar53 = vfmsub231ps_avx512vl(auVar76._0_32_,auVar43,auVar44);
      in_ZMM14 = ZEXT3264(auVar53);
      auVar52._4_4_ = auVar16._4_4_ * auVar48._4_4_;
      auVar52._0_4_ = auVar16._0_4_ * auVar48._0_4_;
      auVar52._8_4_ = auVar16._8_4_ * auVar48._8_4_;
      auVar52._12_4_ = auVar16._12_4_ * auVar48._12_4_;
      auVar52._16_4_ = auVar48._16_4_ * 0.0;
      auVar52._20_4_ = auVar48._20_4_ * 0.0;
      auVar52._24_4_ = auVar48._24_4_ * 0.0;
      auVar52._28_4_ = auVar48._28_4_;
      auVar44 = vfmadd231ps_avx512vl(auVar52,(undefined1  [32])aVar51,auVar44);
      auVar42 = vfmadd231ps_fma(auVar44,ZEXT1632(auVar15),auVar45);
      vandps_avx512vl(ZEXT1632(auVar42),auVar79._0_32_);
      auVar45 = vmulps_avx512vl(auVar50,auVar53);
      auVar45 = vfmadd231ps_avx512vl(auVar45,ZEXT1632(auVar14),auVar77);
      auVar45 = vfmadd231ps_avx512vl(auVar45,ZEXT1632(auVar17),auVar73);
      auVar45 = vxorps_avx512vl(auVar44,auVar45);
      uVar10 = vcmpps_avx512vl(auVar45,auVar80._0_32_,5);
      bVar30 = (byte)uVar10 & (byte)uVar32;
      local_5db8 = CONCAT44(local_5db8._4_4_,uVar32);
      if (bVar30 == 0) {
LAB_01dd199a:
        bVar30 = 0;
      }
      else {
        auVar50._4_4_ = fVar58 * auVar53._4_4_;
        auVar50._0_4_ = fVar58 * auVar53._0_4_;
        auVar50._8_4_ = fVar58 * auVar53._8_4_;
        auVar50._12_4_ = fVar58 * auVar53._12_4_;
        auVar50._16_4_ = fVar58 * auVar53._16_4_;
        auVar50._20_4_ = fVar58 * auVar53._20_4_;
        auVar50._24_4_ = fVar58 * auVar53._24_4_;
        auVar50._28_4_ = fVar58;
        auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar70,auVar50);
        in_ZMM13 = ZEXT1664(auVar14);
        auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar65,ZEXT1632(auVar14));
        auVar66._0_4_ = auVar44._0_4_ ^ auVar17._0_4_;
        auVar66._4_4_ = auVar44._4_4_ ^ auVar17._4_4_;
        auVar66._8_4_ = auVar44._8_4_ ^ auVar17._8_4_;
        auVar66._12_4_ = auVar44._12_4_ ^ auVar17._12_4_;
        auVar66._16_4_ = auVar44._16_4_;
        auVar66._20_4_ = auVar44._20_4_;
        auVar66._24_4_ = auVar44._24_4_;
        auVar66._28_4_ = auVar44._28_4_;
        uVar10 = vcmpps_avx512vl(auVar66,auVar80._0_32_,5);
        bVar30 = bVar30 & (byte)uVar10;
        if (bVar30 == 0) goto LAB_01dd199a;
        auVar22._8_4_ = 0x7fffffff;
        auVar22._0_8_ = 0x7fffffff7fffffff;
        auVar22._12_4_ = 0x7fffffff;
        auVar22._16_4_ = 0x7fffffff;
        auVar22._20_4_ = 0x7fffffff;
        auVar22._24_4_ = 0x7fffffff;
        auVar22._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar42),auVar22);
        auVar48 = vsubps_avx(auVar45,auVar45);
        uVar10 = vcmpps_avx512vl(auVar48,auVar66,5);
        bVar30 = bVar30 & (byte)uVar10;
        if (bVar30 == 0) goto LAB_01dd199a;
        auVar23._4_4_ = auVar47._4_4_ * auVar16._4_4_;
        auVar23._0_4_ = auVar47._0_4_ * auVar16._0_4_;
        auVar23._8_4_ = auVar47._8_4_ * auVar16._8_4_;
        auVar23._12_4_ = auVar47._12_4_ * auVar16._12_4_;
        auVar23._16_4_ = auVar47._16_4_ * 0.0;
        auVar23._20_4_ = auVar47._20_4_ * 0.0;
        auVar23._24_4_ = auVar47._24_4_ * 0.0;
        auVar23._28_4_ = auVar48._28_4_;
        auVar17 = vfmadd213ps_fma(auVar46,(undefined1  [32])aVar51,auVar23);
        auVar17 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar15),ZEXT1632(auVar17));
        auVar68._0_4_ = auVar45._0_4_ * *(float *)(ray + 0x60);
        auVar68._4_4_ = auVar45._4_4_ * *(float *)(ray + 100);
        auVar68._8_4_ = auVar45._8_4_ * *(float *)(ray + 0x68);
        auVar68._12_4_ = auVar45._12_4_ * *(float *)(ray + 0x6c);
        auVar68._16_4_ = auVar45._16_4_ * *(float *)(ray + 0x70);
        auVar68._20_4_ = auVar45._20_4_ * *(float *)(ray + 0x74);
        auVar68._24_4_ = auVar45._24_4_ * *(float *)(ray + 0x78);
        auVar68._28_4_ = 0;
        auVar63._0_4_ = auVar44._0_4_ ^ auVar17._0_4_;
        auVar63._4_4_ = auVar44._4_4_ ^ auVar17._4_4_;
        auVar63._8_4_ = auVar44._8_4_ ^ auVar17._8_4_;
        auVar63._12_4_ = auVar44._12_4_ ^ auVar17._12_4_;
        auVar63._16_4_ = auVar44._16_4_;
        auVar63._20_4_ = auVar44._20_4_;
        auVar63._24_4_ = auVar44._24_4_;
        auVar63._28_4_ = auVar44._28_4_;
        auVar24._4_4_ = auVar45._4_4_ * *(float *)(ray + 0x104);
        auVar24._0_4_ = auVar45._0_4_ * *(float *)(ray + 0x100);
        auVar24._8_4_ = auVar45._8_4_ * *(float *)(ray + 0x108);
        auVar24._12_4_ = auVar45._12_4_ * *(float *)(ray + 0x10c);
        auVar24._16_4_ = auVar45._16_4_ * *(float *)(ray + 0x110);
        auVar24._20_4_ = auVar45._20_4_ * *(float *)(ray + 0x114);
        auVar24._24_4_ = auVar45._24_4_ * *(float *)(ray + 0x118);
        auVar24._28_4_ = auVar48._28_4_;
        uVar10 = vcmpps_avx512vl(auVar63,auVar24,2);
        uVar11 = vcmpps_avx512vl(auVar68,auVar63,1);
        bVar30 = bVar30 & (byte)uVar10 & (byte)uVar11;
        if (bVar30 == 0) {
LAB_01dd1ebb:
          bVar30 = 0;
        }
        else {
          uVar10 = vcmpps_avx512vl(ZEXT1632(auVar42),ZEXT832(0) << 0x20,4);
          bVar30 = bVar30 & (byte)uVar10;
          if (bVar30 == 0) goto LAB_01dd1ebb;
          local_5cc0 = ZEXT1632(auVar15);
          local_5d00 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar16);
          local_5ce0 = aVar51;
          local_5ca0 = auVar45;
          _local_5c80 = auVar63;
          _local_5c60 = auVar66;
          _local_5c40 = auVar45;
        }
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar78 = ZEXT3264(auVar45);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar79 = ZEXT3264(auVar45);
        auVar42 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
        auVar80 = ZEXT1664(auVar42);
      }
      auVar42 = auVar80._0_16_;
      pGVar2 = (local_5dc0->scene->geometries).items[uVar41].ptr;
      uVar1 = pGVar2->mask;
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      uVar10 = vptestmd_avx512vl(auVar55,*(undefined1 (*) [32])(ray + 0x120));
      bVar30 = (byte)uVar10 & bVar30;
      if (bVar30 != 0) {
        local_5d40._0_4_ = *(undefined4 *)(lVar38 + 0x10 + lVar39);
        if ((local_5dc0->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar45 = vrcp14ps_avx512vl(local_5ca0);
          auVar21._8_4_ = 0x3f800000;
          auVar21._0_8_ = 0x3f8000003f800000;
          auVar21._12_4_ = 0x3f800000;
          auVar21._16_4_ = 0x3f800000;
          auVar21._20_4_ = 0x3f800000;
          auVar21._24_4_ = 0x3f800000;
          auVar21._28_4_ = 0x3f800000;
          auVar44 = vfnmadd213ps_avx512vl(auVar45,local_5ca0,auVar21);
          auVar15 = vfmadd132ps_fma(auVar44,auVar45,auVar45);
          fVar56 = auVar15._0_4_;
          fVar58 = auVar15._4_4_;
          fVar59 = auVar15._8_4_;
          fVar60 = auVar15._12_4_;
          local_5ba0._0_4_ = fVar56 * (float)local_5c60._0_4_;
          local_5ba0._4_4_ = fVar58 * (float)local_5c60._4_4_;
          local_5ba0._8_4_ = fVar59 * fStack_5c58;
          local_5ba0._12_4_ = fVar60 * fStack_5c54;
          local_5ba0._16_4_ = fStack_5c50 * 0.0;
          local_5ba0._20_4_ = fStack_5c4c * 0.0;
          local_5ba0._24_4_ = fStack_5c48 * 0.0;
          local_5ba0._28_4_ = 0;
          local_5c20._0_8_ = local_5cc0._0_8_;
          local_5c20._8_8_ = local_5cc0._8_8_;
          local_5c20._16_8_ = local_5cc0._16_8_;
          local_5c20._24_8_ = local_5cc0._24_8_;
          local_5c20.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5ce0;
          local_5c20.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5d00;
          local_5bc0 = CONCAT44(fVar58 * (float)local_5c80._4_4_,fVar56 * (float)local_5c80._0_4_);
          uStack_5bb8 = CONCAT44(fVar60 * fStack_5c74,fVar59 * fStack_5c78);
          uStack_5bb0 = CONCAT44(fStack_5c6c * 0.0,fStack_5c70 * 0.0);
          uStack_5ba8 = CONCAT44(auVar45._28_4_,fStack_5c68 * 0.0);
          local_5b80._4_4_ = fVar58 * (float)local_5c40._4_4_;
          local_5b80._0_4_ = fVar56 * (float)local_5c40._0_4_;
          fStack_5b78 = fVar59 * fStack_5c38;
          fStack_5b74 = fVar60 * fStack_5c34;
          fStack_5b70 = fStack_5c30 * 0.0;
          fStack_5b6c = fStack_5c2c * 0.0;
          fStack_5b68 = fStack_5c28 * 0.0;
          uStack_5b64 = local_5ca0._28_4_;
          local_5d98.valid = (int *)&local_5880;
          local_5d98.geometryUserPtr = &local_5b00;
          local_5d98.context = local_5ae0;
          local_5d98.ray = (RTCRayN *)&local_5ac0;
          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
          in_ZMM14 = ZEXT1664(auVar53._0_16_);
          local_5da0 = pGVar2;
          local_5d58 = uVar41;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5d98,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5c20.field_0);
          local_5b60 = vpbroadcastd_avx512vl();
          _local_5b80 = vpbroadcastd_avx512vl();
          local_5c20._0_8_ = local_5880;
          local_5c20._8_8_ = uStack_5878;
          local_5c20._16_8_ = uStack_5870;
          local_5c20._24_8_ = uStack_5868;
          local_5c20.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5860;
          local_5c20.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5840;
          local_5bc0 = local_5ac0._0_8_;
          uStack_5bb8 = local_5ac0._8_8_;
          uStack_5bb0 = local_5ac0._16_8_;
          uStack_5ba8 = local_5ac0._24_8_;
          vpcmpeqd_avx2(local_5b60,local_5b60);
          uStack_5b3c = local_5dc0->user->instID[0];
          local_5b40 = uStack_5b3c;
          uStack_5b38 = uStack_5b3c;
          uStack_5b34 = uStack_5b3c;
          uStack_5b30 = uStack_5b3c;
          uStack_5b2c = uStack_5b3c;
          uStack_5b28 = uStack_5b3c;
          uStack_5b24 = uStack_5b3c;
          uStack_5b1c = local_5dc0->user->instPrimID[0];
          local_5b20 = uStack_5b1c;
          uStack_5b18 = uStack_5b1c;
          uStack_5b14 = uStack_5b1c;
          uStack_5b10 = uStack_5b1c;
          uStack_5b0c = uStack_5b1c;
          uStack_5b08 = uStack_5b1c;
          uStack_5b04 = uStack_5b1c;
          local_5d40 = *(undefined1 (*) [32])(ray + 0x100);
          auVar45 = vblendmps_avx512vl(local_5d40,(undefined1  [32])local_5b00);
          bVar29 = (bool)(bVar30 >> 1 & 1);
          bVar4 = (bool)(bVar30 >> 2 & 1);
          bVar5 = (bool)(bVar30 >> 3 & 1);
          bVar6 = (bool)(bVar30 >> 4 & 1);
          bVar7 = (bool)(bVar30 >> 5 & 1);
          bVar8 = (bool)(bVar30 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar30 & 1) * auVar45._0_4_ | !(bool)(bVar30 & 1) * uStack_5b1c;
          *(uint *)(ray + 0x104) = (uint)bVar29 * auVar45._4_4_ | !bVar29 * uStack_5b1c;
          *(uint *)(ray + 0x108) = (uint)bVar4 * auVar45._8_4_ | !bVar4 * uStack_5b1c;
          *(uint *)(ray + 0x10c) = (uint)bVar5 * auVar45._12_4_ | !bVar5 * uStack_5b1c;
          *(uint *)(ray + 0x110) = (uint)bVar6 * auVar45._16_4_ | !bVar6 * uStack_5b1c;
          *(uint *)(ray + 0x114) = (uint)bVar7 * auVar45._20_4_ | !bVar7 * uStack_5b1c;
          *(uint *)(ray + 0x118) = (uint)bVar8 * auVar45._24_4_ | !bVar8 * uStack_5b1c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar30 >> 7) * auVar45._28_4_ | !(bool)(bVar30 >> 7) * uStack_5b1c;
          local_5d20 = vpmovm2d_avx512vl((ulong)bVar30);
          local_5d98.valid = (int *)local_5d20;
          local_5d98.geometryUserPtr = local_5da0->userPtr;
          local_5d98.context = local_5dc0->user;
          local_5d98.hit = (RTCHitN *)&local_5c20;
          local_5d98.N = 8;
          local_5d98.ray = (RTCRayN *)ray;
          if (local_5da0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            (*local_5da0->occlusionFilterN)(&local_5d98);
          }
          if (local_5d20 == (undefined1  [32])0x0) {
            uVar41 = 0;
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar78 = ZEXT3264(auVar45);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar79 = ZEXT3264(auVar45);
            auVar42 = vxorps_avx512vl(auVar42,auVar42);
            auVar80 = ZEXT1664(auVar42);
          }
          else {
            p_Var3 = local_5dc0->args->filter;
            if (p_Var3 == (RTCFilterFunctionN)0x0) {
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar78 = ZEXT3264(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar79 = ZEXT3264(auVar45);
              auVar42 = vxorps_avx512vl(auVar42,auVar42);
              auVar80 = ZEXT1664(auVar42);
            }
            else {
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar78 = ZEXT3264(auVar45);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar79 = ZEXT3264(auVar45);
              auVar42 = vxorps_avx512vl(auVar42,auVar42);
              auVar80 = ZEXT1664(auVar42);
              if (((local_5dc0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5da0->field_8).field_0x2 & 0x40) != 0)
                 ) {
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                (*p_Var3)(&local_5d98);
                auVar42 = vxorps_avx512vl(auVar42,auVar42);
                auVar80 = ZEXT1664(auVar42);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar79 = ZEXT3264(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar78 = ZEXT3264(auVar45);
              }
            }
            uVar41 = vptestmd_avx512vl(local_5d20,local_5d20);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar29 = (bool)((byte)uVar41 & 1);
            auVar54._0_4_ =
                 (uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * *(int *)(local_5d98.ray + 0x100);
            bVar29 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar54._4_4_ =
                 (uint)bVar29 * auVar45._4_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 4);
            bVar29 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar54._8_4_ =
                 (uint)bVar29 * auVar45._8_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 8);
            bVar29 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar54._12_4_ =
                 (uint)bVar29 * auVar45._12_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 0xc);
            bVar29 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar54._16_4_ =
                 (uint)bVar29 * auVar45._16_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 0x10);
            bVar29 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar54._20_4_ =
                 (uint)bVar29 * auVar45._20_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 0x14);
            bVar29 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar54._24_4_ =
                 (uint)bVar29 * auVar45._24_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 0x18);
            bVar29 = SUB81(uVar41 >> 7,0);
            auVar54._28_4_ =
                 (uint)bVar29 * auVar45._28_4_ |
                 (uint)!bVar29 * *(int *)((RayK<8> *)(local_5d98.ray + 0x100) + 0x1c);
            *(undefined1 (*) [32])(local_5d98.ray + 0x100) = auVar54;
          }
          bVar30 = (byte)uVar41;
          bVar29 = (bool)((byte)(uVar41 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar41 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar41 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar41 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar41 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar41 >> 6) & 1);
          bVar9 = SUB81(uVar41 >> 7,0);
          *(uint *)local_5da8 =
               (uint)(bVar30 & 1) * *(int *)local_5da8 |
               (uint)!(bool)(bVar30 & 1) * local_5d40._0_4_;
          *(uint *)(local_5da8 + 4) =
               (uint)bVar29 * *(int *)(local_5da8 + 4) | (uint)!bVar29 * local_5d40._4_4_;
          *(uint *)(local_5da8 + 8) =
               (uint)bVar4 * *(int *)(local_5da8 + 8) | (uint)!bVar4 * local_5d40._8_4_;
          *(uint *)(local_5da8 + 0xc) =
               (uint)bVar5 * *(int *)(local_5da8 + 0xc) | (uint)!bVar5 * local_5d40._12_4_;
          *(uint *)(local_5da8 + 0x10) =
               (uint)bVar6 * *(int *)(local_5da8 + 0x10) | (uint)!bVar6 * local_5d40._16_4_;
          *(uint *)(local_5da8 + 0x14) =
               (uint)bVar7 * *(int *)(local_5da8 + 0x14) | (uint)!bVar7 * local_5d40._20_4_;
          *(uint *)(local_5da8 + 0x18) =
               (uint)bVar8 * *(int *)(local_5da8 + 0x18) | (uint)!bVar8 * local_5d40._24_4_;
          *(uint *)(local_5da8 + 0x1c) =
               (uint)bVar9 * *(int *)(local_5da8 + 0x1c) | (uint)!bVar9 * local_5d40._28_4_;
        }
        uVar32 = CONCAT31((int3)(local_5db8 >> 8),(byte)local_5db8 & ~bVar30);
      }
      lVar39 = lVar39 + 4;
      uVar1 = local_5dac;
      lVar33 = local_5d48;
    } while ((char)uVar32 != '\0');
    uVar32 = 0;
LAB_01dd1ec5:
    lVar33 = local_5d48 + 1;
    lVar38 = lVar38 + 0xb0;
    bVar30 = (byte)local_5dac & (byte)uVar32;
    uVar32 = CONCAT31((int3)(local_5dac >> 8),bVar30);
  } while (bVar30 != 0);
  uVar32 = 0;
LAB_01dd1ee6:
  bVar30 = (byte)local_5ddc | ~(byte)uVar32;
  local_5ddc = (uint)bVar30;
  if (bVar30 == 0xff) {
    bVar30 = 0xff;
    goto LAB_01dd2015;
  }
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_58a0._0_4_ =
       (uint)(bVar30 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar30 & 1) * local_58a0._0_4_;
  bVar29 = (bool)(bVar30 >> 1 & 1);
  local_58a0._4_4_ = (uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * local_58a0._4_4_;
  bVar29 = (bool)(bVar30 >> 2 & 1);
  local_58a0._8_4_ = (uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * local_58a0._8_4_;
  bVar29 = (bool)(bVar30 >> 3 & 1);
  local_58a0._12_4_ = (uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * local_58a0._12_4_;
  bVar29 = (bool)(bVar30 >> 4 & 1);
  local_58a0._16_4_ = (uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * local_58a0._16_4_;
  bVar29 = (bool)(bVar30 >> 5 & 1);
  local_58a0._20_4_ = (uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * local_58a0._20_4_;
  bVar29 = (bool)(bVar30 >> 6 & 1);
  local_58a0._24_4_ = (uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * local_58a0._24_4_;
  local_58a0._28_4_ =
       (uint)(bVar30 >> 7) * auVar45._28_4_ | (uint)!(bool)(bVar30 >> 7) * local_58a0._28_4_;
  goto LAB_01dd165f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }